

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpectedFunctionsListTest.cpp
# Opt level: O2

void __thiscall
TEST_MockExpectedCallsList_listWithUnFulfilledExpectationHasNoUnfillfilledOnes_Test::
~TEST_MockExpectedCallsList_listWithUnFulfilledExpectationHasNoUnfillfilledOnes_Test
          (TEST_MockExpectedCallsList_listWithUnFulfilledExpectationHasNoUnfillfilledOnes_Test *this
          )

{
  Utest::~Utest((Utest *)this);
  operator_delete(this,0x30);
  return;
}

Assistant:

TEST(MockExpectedCallsList, listWithUnFulfilledExpectationHasNoUnfillfilledOnes)
{
    call1->callWasMade(1);
    call3->callWasMade(2);
    list->addExpectedCall(call1);
    list->addExpectedCall(call2);
    list->addExpectedCall(call3);
    CHECK(list->hasUnfulfilledExpectations());
}